

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecProtocol.cpp
# Opt level: O3

char * HdmiCec::GetDevAddressString(DevAddress devAddress)

{
  if (devAddress < 0x10) {
    return &DAT_0010b4d4 + *(int *)(&DAT_0010b4d4 + (ulong)devAddress * 4);
  }
  return "Invalid";
}

Assistant:

const char* GetDevAddressString( DevAddress devAddress )
    {
        switch( devAddress )
        {
        case DevAddress_TV:
            return "TV";
        case DevAddress_Recorder1:
            return "Recorder1";
        case DevAddress_Recorder2:
            return "Recorder2";
        case DevAddress_Tuner1:
            return "Tuner1";
        case DevAddress_Player1:
            return "Player1";
        case DevAddress_AudioSystem:
            return "AudioSystem";
        case DevAddress_Tuner2:
            return "Tuner2";
        case DevAddress_Tuner3:
            return "Tuner3";
        case DevAddress_Player2:
            return "Player2";
        case DevAddress_Recorder3:
            return "Recorder3";
        case DevAddress_Tuner4:
            return "Tuner4";
        case DevAddress_Player3:
            return "Player3";
        case DevAddress_Reserved1:
            return "Reserved1";
        case DevAddress_Reserved2:
            return "Reserved2";
        case DevAddress_FreeUse:
            return "FreeUse";
        case DevAddress_UnregBcast:
            return "Unreg/Bcast";
        default:
            break;
        }
        return "Invalid";
    }